

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

double __thiscall
MidiInApi::getMessage
          (MidiInApi *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *message)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  double timeStamp;
  double local_40;
  string local_38;
  
  puVar1 = (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if ((this->inputData_).usingCallback == true) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiApi).errorString_,0,
               (char *)(this->super_MidiApi).errorString_._M_string_length,0x110a21);
    pcVar2 = (this->super_MidiApi).errorString_._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,
               pcVar2 + (this->super_MidiApi).errorString_._M_string_length);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return 0.0;
    }
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  else {
    bVar3 = MidiQueue::pop(&(this->inputData_).queue,message,&local_40);
    if (bVar3) {
      return local_40;
    }
  }
  return 0.0;
}

Assistant:

double MidiInApi :: getMessage( std::vector<unsigned char> *message )
{
  message->clear();

  if ( inputData_.usingCallback ) {
    errorString_ = "RtMidiIn::getNextMessage: a user callback is currently set for this port.";
    error( RtMidiError::WARNING, errorString_ );
    return 0.0;
  }

  double timeStamp;
  if ( !inputData_.queue.pop( message, &timeStamp ) )
    return 0.0;

  return timeStamp;
}